

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  bool bVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  uint uVar5;
  pointer pnVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint *puVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  undefined4 *puVar18;
  Item *pIVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  byte bVar21;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nzval;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_228;
  cpp_dec_float<200U,_int,_void> local_1a0;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  
  bVar21 = 0;
  iVar9 = *(x->super_IdxSet).idx;
  pnVar6 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar15 = (uint *)(pnVar6 + iVar9);
  pcVar16 = &local_1a0;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar16->data)._M_elems[0] = *puVar15;
    puVar15 = puVar15 + 1;
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((pcVar16->data)._M_elems + 1);
  }
  iVar2 = pnVar6[iVar9].m_backend.exp;
  local_1a0.exp = iVar2;
  bVar1 = pnVar6[iVar9].m_backend.neg;
  local_1a0.neg = bVar1;
  fVar3 = pnVar6[iVar9].m_backend.fpclass;
  local_1a0.fpclass = fVar3;
  iVar4 = pnVar6[iVar9].m_backend.prec_elem;
  local_1a0.prec_elem = iVar4;
  pIVar19 = (A->set).theitem + (A->set).thekey[iVar9].idx;
  pcVar16 = &local_1a0;
  puVar15 = local_a0;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    *puVar15 = (pcVar16->data)._M_elems[0];
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((pcVar16->data)._M_elems + 1);
    puVar15 = puVar15 + 1;
  }
  a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
  puVar15 = local_a0;
  pcVar16 = &local_120;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pcVar16->data)._M_elems[0] = *puVar15;
    puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar21 * -2 + 1) * 4);
  }
  local_120.exp = iVar2;
  local_120.neg = bVar1;
  local_120.fpclass = fVar3;
  local_120.prec_elem = iVar4;
  if ((bVar1 == true) && (local_120.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
    local_120.neg = false;
  }
  if ((fVar3 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_228.fpclass = cpp_dec_float_finite;
    local_228.prec_elem = 0x1c;
    local_228.data._M_elems[0] = 0;
    local_228.data._M_elems[1] = 0;
    local_228.data._M_elems[2] = 0;
    local_228.data._M_elems[3] = 0;
    local_228.data._M_elems[4] = 0;
    local_228.data._M_elems[5] = 0;
    local_228.data._M_elems[6] = 0;
    local_228.data._M_elems[7] = 0;
    local_228.data._M_elems[8] = 0;
    local_228.data._M_elems[9] = 0;
    local_228.data._M_elems[10] = 0;
    local_228.data._M_elems[0xb] = 0;
    local_228.data._M_elems[0xc] = 0;
    local_228.data._M_elems[0xd] = 0;
    local_228.data._M_elems[0xe] = 0;
    local_228.data._M_elems[0xf] = 0;
    local_228.data._M_elems[0x10] = 0;
    local_228.data._M_elems[0x11] = 0;
    local_228.data._M_elems[0x12] = 0;
    local_228.data._M_elems[0x13] = 0;
    local_228.data._M_elems[0x14] = 0;
    local_228.data._M_elems[0x15] = 0;
    local_228.data._M_elems[0x16] = 0;
    local_228.data._M_elems[0x17] = 0;
    local_228.data._M_elems[0x18] = 0;
    local_228.data._M_elems[0x19] = 0;
    local_228.data._M_elems._104_5_ = 0;
    local_228.data._M_elems[0x1b]._1_3_ = 0;
    local_228.exp = 0;
    local_228.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_228,a);
    iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_120,&local_228);
    if (iVar9 < 1) goto LAB_00525caa;
  }
  uVar5 = (pIVar19->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  uVar10 = (ulong)uVar5;
  if (uVar10 != 0) {
    *(uint *)(this + 8) = uVar5;
    if ((int)uVar5 < 1) {
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
    lVar12 = uVar10 + 1;
    lVar8 = uVar10 * 0x84;
    do {
      pNVar7 = (pIVar19->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)&pNVar7[-1].val.m_backend.data + lVar8);
      *(undefined4 *)(*(long *)(this + 0x10) + -8 + lVar12 * 4) =
           *(undefined4 *)((long)(&pNVar7[-1].val + 1) + lVar8);
      local_228.fpclass = cpp_dec_float_finite;
      local_228.prec_elem = 0x1c;
      local_228.data._M_elems[0] = 0;
      local_228.data._M_elems[1] = 0;
      local_228.data._M_elems[2] = 0;
      local_228.data._M_elems[3] = 0;
      local_228.data._M_elems[4] = 0;
      local_228.data._M_elems[5] = 0;
      local_228.data._M_elems[6] = 0;
      local_228.data._M_elems[7] = 0;
      local_228.data._M_elems[8] = 0;
      local_228.data._M_elems[9] = 0;
      local_228.data._M_elems[10] = 0;
      local_228.data._M_elems[0xb] = 0;
      local_228.data._M_elems[0xc] = 0;
      local_228.data._M_elems[0xd] = 0;
      local_228.data._M_elems[0xe] = 0;
      local_228.data._M_elems[0xf] = 0;
      local_228.data._M_elems[0x10] = 0;
      local_228.data._M_elems[0x11] = 0;
      local_228.data._M_elems[0x12] = 0;
      local_228.data._M_elems[0x13] = 0;
      local_228.data._M_elems[0x14] = 0;
      local_228.data._M_elems[0x15] = 0;
      local_228.data._M_elems[0x16] = 0;
      local_228.data._M_elems[0x17] = 0;
      local_228.data._M_elems[0x18] = 0;
      local_228.data._M_elems[0x19] = 0;
      local_228.data._M_elems._104_5_ = 0;
      local_228.data._M_elems[0x1b]._1_3_ = 0;
      local_228.exp = 0;
      local_228.neg = false;
      pcVar16 = &local_1a0;
      if (pcVar20 != &local_228) {
        pcVar17 = &local_228;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *(uint *)pcVar17 = (pcVar16->data)._M_elems[0];
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar21 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar21 * -2 + 1) * 4)
          ;
        }
        local_228.exp = local_1a0.exp;
        local_228.neg = local_1a0.neg;
        local_228.prec_elem = local_1a0.prec_elem;
        local_228.fpclass = local_1a0.fpclass;
        pcVar16 = pcVar20;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_228,pcVar16);
      lVar13 = *(long *)(this + 0x20);
      lVar11 = (long)(int)pcVar20[1].data._M_elems[0] * 0x80;
      pcVar16 = &local_228;
      puVar18 = (undefined4 *)(lVar13 + lVar11);
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar18 = *(undefined4 *)pcVar16;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar21 * -2 + 1) * 4);
        puVar18 = puVar18 + (ulong)bVar21 * -2 + 1;
      }
      *(int *)(lVar13 + 0x70 + lVar11) = local_228.exp;
      *(bool *)(lVar13 + 0x74 + lVar11) = local_228.neg;
      *(undefined8 *)(lVar13 + 0x78 + lVar11) = local_228._120_8_;
      lVar12 = lVar12 + -1;
      lVar8 = lVar8 + -0x84;
    } while (1 < lVar12);
    return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)this;
  }
LAB_00525caa:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product1(const SVSetBase<S>& A, const SSVectorBase<T>& x)
{
   assert(x.isSetup());
   assert(x.size() == 1);

   // get the nonzero value of x and the corresponding vector in A:
   const int nzidx = x.idx[0];
   const T nzval = x.val[nzidx];
   const SVectorBase<S>& Ai = A[nzidx];

   // compute A[nzidx] * nzval:
   if(isZero(nzval, this->tolerances()->epsilon()) || Ai.size() == 0)
      clear();    // this := zero vector
   else
   {
      num = Ai.size();

      for(int j = num - 1; j >= 0; --j)
      {
         const Nonzero<S>& Aij = Ai.element(j);
         idx[j] = Aij.idx;
         VectorBase<R>::val[Aij.idx] = nzval * Aij.val;
      }
   }

   assert(isConsistent());

   return *this;
}